

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O0

void __thiscall Module::clean(Module *this)

{
  bool bVar1;
  const_iterator o;
  QUndoStack *stack;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QUndoStack_*> *__range1;
  QList<QUndoStack_*> stacks;
  Module *this_local;
  
  this->mPermaDirty = false;
  stacks.d.size = (qsizetype)this;
  if ((this->mModified & 1U) != 0) {
    this->mModified = false;
    modifiedChanged(this,false);
  }
  QUndoGroup::stacks();
  __end1 = QList<QUndoStack_*>::begin((QList<QUndoStack_*> *)&__range1);
  o = QList<QUndoStack_*>::end((QList<QUndoStack_*> *)&__range1);
  while( true ) {
    bVar1 = QList<QUndoStack_*>::const_iterator::operator!=(&__end1,o);
    if (!bVar1) break;
    QList<QUndoStack_*>::const_iterator::operator*(&__end1);
    QUndoStack::setClean();
    QList<QUndoStack_*>::const_iterator::operator++(&__end1);
  }
  QList<QUndoStack_*>::~QList((QList<QUndoStack_*> *)&__range1);
  return;
}

Assistant:

void Module::clean() {
    mPermaDirty = false;
    if (mModified) {
        mModified = false;
        emit modifiedChanged(false);
    }
    auto const stacks = mUndoGroup->stacks();
    for (auto stack : stacks) {
        stack->setClean();
    }
}